

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O0

PropertyDefinition * __thiscall
Rml::PropertyDefinition::AddParser
          (PropertyDefinition *this,String *parser_name,String *parser_parameters)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  type piVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  String unparsed_value;
  undefined1 local_f8 [4];
  int parser_index;
  String local_d8;
  long local_b8;
  size_t i_equal;
  String *parameter;
  iterator __end2;
  iterator __begin2;
  StringList *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88 [4];
  int parameter_value;
  StringList parameter_list;
  undefined1 local_60 [8];
  ParserState new_parser;
  String *parser_parameters_local;
  String *parser_name_local;
  PropertyDefinition *this_local;
  
  new_parser.parameters._40_8_ = parser_parameters;
  ParserState::ParserState((ParserState *)local_60);
  local_60 = (undefined1  [8])StyleSheetSpecification::GetParser(parser_name);
  if (local_60 == (undefined1  [8])0x0) {
    uVar4 = ::std::__cxx11::string::c_str();
    Log::Message(LT_ERROR,"Property was registered with invalid parser \'%s\'.",uVar4);
    parameter_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    this_local = this;
  }
  else {
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(local_88);
      StringUtilities::ExpandString
                ((StringList *)local_88,(String *)new_parser.parameters._40_8_,',');
      __range2._4_4_ = 0;
      __end2 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_88);
      parameter = (String *)
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(local_88);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&parameter), bVar2) {
        i_equal = (size_t)__gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end2);
        local_b8 = ::std::__cxx11::string::find((char)i_equal,0x3d);
        if (local_b8 != -1) {
          ::std::__cxx11::string::substr((ulong)&local_d8,i_equal);
          bVar2 = TypeConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  ::Convert(&local_d8,(int *)((long)&__range2 + 4));
          ::std::__cxx11::string::~string((string *)&local_d8);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            uVar4 = ::std::__cxx11::string::c_str();
            Log::Message(LT_ERROR,"Parser was added with invalid parameter \'%s\'.",uVar4);
            parameter_list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            this_local = this;
            goto LAB_005da885;
          }
        }
        iVar1 = __range2._4_4_;
        ::std::__cxx11::string::substr((ulong)local_f8,i_equal);
        piVar6 = robin_hood::detail::
                 Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]<int>((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&new_parser,(key_type *)local_f8);
        *piVar6 = iVar1;
        ::std::__cxx11::string::~string((string *)local_f8);
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      parameter_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
LAB_005da885:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_88);
      if ((int)parameter_list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_005da9fa;
    }
    sVar7 = ::std::
            vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
            ::size(&this->parsers);
    unparsed_value.field_2._12_4_ = (undefined4)sVar7;
    ::std::
    vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
    ::push_back(&this->parsers,(value_type *)local_60);
    if ((this->default_value).unit == UNKNOWN) {
      ::std::__cxx11::string::string((string *)&local_140);
      Variant::Get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 &(this->default_value).value,&local_140);
      ::std::__cxx11::string::~string((string *)&local_140);
      uVar3 = (*(*(_func_int ***)local_60)[2])(local_60,&this->default_value,local_120,&new_parser);
      if ((uVar3 & 1) == 0) {
        Variant::operator=(&(this->default_value).value,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120);
        (this->default_value).unit = UNKNOWN;
      }
      else {
        (this->default_value).parser_index = unparsed_value.field_2._12_4_;
      }
      ::std::__cxx11::string::~string((string *)local_120);
    }
    parameter_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    this_local = this;
  }
LAB_005da9fa:
  ParserState::~ParserState((ParserState *)local_60);
  return this_local;
}

Assistant:

PropertyDefinition& PropertyDefinition::AddParser(const String& parser_name, const String& parser_parameters)
{
	ParserState new_parser;

	// Fetch the parser.
	new_parser.parser = StyleSheetSpecification::GetParser(parser_name);
	if (new_parser.parser == nullptr)
	{
		Log::Message(Log::LT_ERROR, "Property was registered with invalid parser '%s'.", parser_name.c_str());
		return *this;
	}

	// Split the parameter list, and set up the map.
	if (!parser_parameters.empty())
	{
		StringList parameter_list;
		StringUtilities::ExpandString(parameter_list, parser_parameters);

		int parameter_value = 0;
		for (const String& parameter : parameter_list)
		{
			// Look for an optional parameter value such as in "normal=400".
			const size_t i_equal = parameter.find('=');
			if (i_equal != String::npos)
			{
				if (!TypeConverter<String, int>::Convert(parameter.substr(i_equal + 1), parameter_value))
				{
					Log::Message(Log::LT_ERROR, "Parser was added with invalid parameter '%s'.", parameter.c_str());
					return *this;
				}
			}

			new_parser.parameters[parameter.substr(0, i_equal)] = parameter_value;
			parameter_value += 1;
		}
	}

	const int parser_index = (int)parsers.size();
	parsers.push_back(new_parser);

	// If the default value has not been parsed successfully yet, run it through the new parser.
	if (default_value.unit == Unit::UNKNOWN)
	{
		String unparsed_value = default_value.value.Get<String>();
		if (new_parser.parser->ParseValue(default_value, unparsed_value, new_parser.parameters))
		{
			default_value.parser_index = parser_index;
		}
		else
		{
			default_value.value = unparsed_value;
			default_value.unit = Unit::UNKNOWN;
		}
	}

	return *this;
}